

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O0

REF_STATUS ref_cell_replace_whole(REF_CELL ref_cell,REF_INT cell,REF_INT *nodes)

{
  uint uVar1;
  int iVar2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT node;
  REF_INT *nodes_local;
  REF_INT cell_local;
  REF_CELL ref_cell_local;
  
  if (((cell < 0) || (ref_cell->max <= cell)) || (ref_cell->c2n[ref_cell->size_per * cell] == -1)) {
    ref_cell_local._4_4_ = 1;
  }
  else {
    for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < ref_cell->node_per;
        ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
      uVar1 = ref_adj_remove(ref_cell->ref_adj,
                             ref_cell->c2n[ref_private_macro_code_rss_1 + ref_cell->size_per * cell]
                             ,cell);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
               0x326,"ref_cell_replace_whole",(ulong)uVar1,"unregister cell");
        return uVar1;
      }
      ref_cell->c2n[ref_private_macro_code_rss_1 + ref_cell->size_per * cell] =
           nodes[ref_private_macro_code_rss_1];
      uVar1 = ref_adj_add(ref_cell->ref_adj,nodes[ref_private_macro_code_rss_1],cell);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
               0x329,"ref_cell_replace_whole",(ulong)uVar1,"register cell with id");
        return uVar1;
      }
    }
    if (ref_cell->last_node_is_an_id != 0) {
      iVar2 = ref_cell->size_per + -1;
      ref_cell->c2n[iVar2 + ref_cell->size_per * cell] = nodes[iVar2];
    }
    ref_cell_local._4_4_ = 0;
  }
  return ref_cell_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_cell_replace_whole(REF_CELL ref_cell, REF_INT cell,
                                          REF_INT *nodes) {
  REF_INT node;
  if (!ref_cell_valid(ref_cell, cell)) return REF_FAILURE;

  for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
    RSS(ref_adj_remove(ref_cell->ref_adj, ref_cell_c2n(ref_cell, node, cell),
                       cell),
        "unregister cell");
    ref_cell_c2n(ref_cell, node, cell) = nodes[node];
    RSS(ref_adj_add(ref_cell->ref_adj, nodes[node], cell),
        "register cell with id");
  }

  if (ref_cell_last_node_is_an_id(ref_cell)) {
    node = ref_cell_size_per(ref_cell) - 1;
    ref_cell_c2n(ref_cell, node, cell) = nodes[node];
  }

  return REF_SUCCESS;
}